

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Insert<phmap::parallel_node_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Insert<phmap::parallel_node_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  mt19937_64 *__urng;
  long lVar3;
  char *pcVar4;
  tuple<const_int_&> *args_1;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *args_1_00;
  T val2;
  T val;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_530;
  AssertHelper local_528;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_518;
  undefined1 local_510 [8];
  undefined1 local_508 [8];
  _Head_base<0UL,_const_int_&,_false> _Stack_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  ctrl_t *local_4e8;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_4e0;
  bool local_4d8;
  AssertHelper local_4d0;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
  local_4c8;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  local_490;
  
  local_510 = (undefined1  [8])
              hash_internal::Generator<std::pair<const_int,_int>,_void>::operator()
                        ((Generator<std::pair<const_int,_int>,_void> *)&local_490);
  lVar3 = 0x40;
  do {
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar3 + -0x30) = 0;
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar3 + -0x28) = 0;
    *(undefined8 *)((long)&local_4d0.data_ + lVar3) = 0;
    *(undefined8 *)((long)&local_4c8.first.inner_ + lVar3) = 0;
    *(undefined8 *)((long)local_490.sets_._M_elems + lVar3 + -0x18) = 0;
    *(long *)((long)local_490.sets_._M_elems + lVar3 + -0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)local_490.sets_._M_elems + lVar3 + -8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar3) = 0;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x4c0);
  _Stack_500._M_head_impl = (int *)(local_510 + 4);
  local_508 = (undefined1  [8])local_510;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_510._0_4_;
  args_1 = (tuple<const_int_&> *)local_508;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int_const&>>
            (&local_4c8,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_490,(int *)local_508,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,args_1,
             (tuple<const_int_&> *)&_Stack_500);
  local_520._M_head_impl._0_1_ = local_4c8.second;
  local_518 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_4c8.second == false) {
    testing::Message::Message((Message *)&local_528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_508,(internal *)&local_520,(AssertionResult *)"p.second","false",
               "true",(char *)args_1);
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x39,(char *)local_508);
    testing::internal::AssertHelper::operator=(&local_530,(Message *)&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    if (local_508 != (undefined1  [8])&local_4f8) {
      operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
    }
    if ((long *)CONCAT44(local_528.data_._4_4_,(int)local_528.data_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_528.data_._4_4_,(int)local_528.data_) + 8))();
    }
    if (local_518 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_518,local_518);
    }
  }
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_508,"val","*p.first",(pair<const_int,_int> *)local_510,
             *local_4c8.first.it_.field_1.slot_);
  if (local_508[0] == '\0') {
    testing::Message::Message((Message *)&local_520);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_500._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)_Stack_500._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_528,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_528,(Message *)&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_528);
    if (local_520._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_520._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_500._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_500,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_500._M_head_impl);
  }
  local_508 = (undefined1  [8])0x7fffffff00000000;
  __urng = hash_internal::GetSharedRng();
  local_528.data_._4_4_ =
       std::uniform_int_distribution<int>::operator()
                 ((uniform_int_distribution<int> *)local_508,__urng,(param_type *)local_508);
  local_518 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&local_528.data_ + 4);
  local_528.data_._0_4_ = local_510._0_4_;
  local_520._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_528;
  args_1_00 = &local_520;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)local_510._0_4_;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<int_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>::iterator,_bool>
              *)local_508,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&local_490,(int *)local_520._M_head_impl,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,(tuple<const_int_&> *)args_1_00,
             (tuple<const_int_&> *)&local_518);
  local_4c8.first.inner_ = (Inner *)local_508;
  local_4c8.first.inner_end_ = (Inner *)_Stack_500._M_head_impl;
  local_4c8.first.it_.ctrl_ = (ctrl_t *)local_4f8._0_8_;
  local_4c8.first.it_.field_1 = (anon_union_8_1_a8a14541_for_iterator_1)local_4f8._8_8_;
  local_4c8.first.it_end_.ctrl_ = local_4e8;
  local_4c8.first.it_end_.field_1 = aStack_4e0;
  local_4c8.second = local_4d8;
  local_520._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_520._M_head_impl._1_7_,local_4d8) ^ 1);
  local_518 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_4d8 != false) {
    testing::Message::Message((Message *)&local_530);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_508,(internal *)&local_520,(AssertionResult *)"p.second","true",
               "false",(char *)args_1_00);
    testing::internal::AssertHelper::AssertHelper
              (&local_4d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3d,(char *)local_508);
    testing::internal::AssertHelper::operator=(&local_4d0,(Message *)&local_530);
    testing::internal::AssertHelper::~AssertHelper(&local_4d0);
    if (local_508 != (undefined1  [8])&local_4f8) {
      operator_delete((void *)local_508,(ulong)(local_4f8._0_8_ + 1));
    }
    if (local_530.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_530.data_ + 8))();
    }
    if (local_518 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_518,local_518);
    }
  }
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_508,"val","*p.first",(pair<const_int,_int> *)local_510,
             *local_4c8.first.it_.field_1.slot_);
  if (local_508[0] == '\0') {
    testing::Message::Message((Message *)&local_520);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_500._M_head_impl
        == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)_Stack_500._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_530,(Message *)&local_520);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    if (local_520._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_520._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_500._M_head_impl
      != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_500,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_500._M_head_impl);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  ::~parallel_hash_set(&local_490);
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Insert) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto p = m.insert(val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.insert(val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
}